

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MedianFilterCV_8U.cpp
# Opt level: O0

pair<unsigned_char,_unsigned_char> __thiscall
MedianFilterCV_8U::getPairMedian(MedianFilterCV_8U *this,Mat *image,int y,int x,bool pairOnOneLine)

{
  uchar uVar1;
  uchar local_2f [6];
  byte local_29;
  undefined1 uStack_28;
  uchar mergeResult [6];
  bool pairOnOneLine_local;
  int x_local;
  int y_local;
  Mat *image_local;
  MedianFilterCV_8U *this_local;
  pair<unsigned_char,_unsigned_char> pairOfMedians;
  
  local_29 = pairOnOneLine;
  _uStack_28 = x;
  unique0x10000250 = y;
  if (((x == 1) && (!pairOnOneLine)) || ((y == 1 && (pairOnOneLine)))) {
    if (pairOnOneLine) {
      initThreeAdjacentPixels(this,image,this->thirdTempArray,y + -1,x,pairOnOneLine);
      initThreeAdjacentPixels
                (this,image,this->fourthTempArray,stack0xffffffffffffffdc,_uStack_28,
                 (bool)(local_29 & 1));
    }
    else {
      initThreeAdjacentPixels(this,image,this->thirdTempArray,y,x + -1,pairOnOneLine);
      initThreeAdjacentPixels
                (this,image,this->fourthTempArray,stack0xffffffffffffffdc,_uStack_28,
                 (bool)(local_29 & 1));
    }
    sortThreeElements(this,this->thirdTempArray);
    sortThreeElements(this,this->fourthTempArray);
  }
  std::swap<unsigned_char,3ul>(&this->firstTempArray,&this->thirdTempArray);
  std::swap<unsigned_char,3ul>(&this->secondTempArray,&this->fourthTempArray);
  if ((local_29 & 1) == 0) {
    initThreeAdjacentPixels
              (this,image,this->thirdTempArray,stack0xffffffffffffffdc,_uStack_28 + 1,
               (bool)(local_29 & 1));
    initThreeAdjacentPixels
              (this,image,this->fourthTempArray,stack0xffffffffffffffdc,_uStack_28 + 2,
               (bool)(local_29 & 1));
  }
  else {
    initThreeAdjacentPixels
              (this,image,this->thirdTempArray,stack0xffffffffffffffdc + 1,_uStack_28,
               (bool)(local_29 & 1));
    initThreeAdjacentPixels
              (this,image,this->fourthTempArray,stack0xffffffffffffffdc + 2,_uStack_28,
               (bool)(local_29 & 1));
  }
  sortThreeElements(this,this->thirdTempArray);
  sortThreeElements(this,this->fourthTempArray);
  mergeTwoSortedArray(this,this->secondTempArray,3,this->thirdTempArray,3,local_2f);
  std::pair<unsigned_char,_unsigned_char>::pair<unsigned_char,_unsigned_char,_true>
            ((pair<unsigned_char,_unsigned_char> *)((long)&this_local + 6));
  uVar1 = getMedianOfTwoSortedArray(this,local_2f,6,this->firstTempArray,3);
  this_local._6_2_ = (pair<unsigned_char,_unsigned_char>)CONCAT11(this_local._7_1_,uVar1);
  uVar1 = getMedianOfTwoSortedArray(this,local_2f,6,this->fourthTempArray,3);
  this_local._6_2_ = (pair<unsigned_char,_unsigned_char>)CONCAT11(uVar1,this_local._6_1_);
  return this_local._6_2_;
}

Assistant:

std::pair<uchar, uchar> MedianFilterCV_8U::getPairMedian(const cv::Mat &image, int y, int x, bool pairOnOneLine) {
    // PairOnOneLine - true, if we are looking for medians on one line,
    //                false, if on one column
    if ((x == 1 && !pairOnOneLine) || (y == 1 && pairOnOneLine)) {                         // 7 operations
        //if we are looking for median on second line or second column
        //need init must fill out and initialize third and fourth temp array
        if (pairOnOneLine) {                                                               // 1 operation
            initThreeAdjacentPixels(image, thirdTempArray, y - 1, x, pairOnOneLine);       // 14| 2 operations + operations of init(12)
            initThreeAdjacentPixels(image, fourthTempArray, y, x, pairOnOneLine);          // 13| 1 operations + operations of init(12)
        } else {
            initThreeAdjacentPixels(image, thirdTempArray, y, x - 1, pairOnOneLine);       // 13| 2 operations + operations of init(12)
            initThreeAdjacentPixels(image, fourthTempArray, y, x, pairOnOneLine);          // 13| 1 operations + operations of init(12)
        }

        sortThreeElements(thirdTempArray);                                                 // 43| 1 operations + operations of sort(42)
        sortThreeElements(fourthTempArray);                                                // 43| 1 operations + operations of sort(42)
    }

    // The values ​​sorted in the last step are written to first and second temp array
    std::swap(firstTempArray, thirdTempArray);                                             // 4 operations
    std::swap(secondTempArray, fourthTempArray);                                           // 4 operations

    if (pairOnOneLine) {                                                                   // 1 operation
        initThreeAdjacentPixels(image, thirdTempArray, y + 1, x, pairOnOneLine);           // 2 operations
        initThreeAdjacentPixels(image, fourthTempArray, y + 2, x, pairOnOneLine);          // 2 operations
    } else {
        initThreeAdjacentPixels(image, thirdTempArray, y, x + 1, pairOnOneLine);           // 2 operations
        initThreeAdjacentPixels(image, fourthTempArray, y, x + 2, pairOnOneLine);          // 2 operations
    }

    sortThreeElements(thirdTempArray);                                                     // 43| 1 operation + operations of sort(42)
    sortThreeElements(fourthTempArray);                                                    // 43| 1 operation + operations of sort(42)

    uchar mergeResult[6];                                                                  // 1 operation
    mergeTwoSortedArray(secondTempArray, 3, thirdTempArray, 3, mergeResult);               // 118| 1 operation + operations of merge(117)

    std::pair<uchar, uchar> pairOfMedians;                                                 // 1 operations

    pairOfMedians.first = getMedianOfTwoSortedArray(mergeResult, 6, firstTempArray, 3);    // 98| 3 operations + opeations of getMedian(95)
    pairOfMedians.second = getMedianOfTwoSortedArray(mergeResult, 6, fourthTempArray, 3);  // 98| 3 operations + opeations of getMedian(95)

    return pairOfMedians;                                                                  // 1 operation
}